

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_HANDLE IoTHubMessage_CreateFromString(char *source)

{
  LOGGER_LOG p_Var1;
  STRING_HANDLE pSVar2;
  MAP_HANDLE pMVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_HANDLE_DATA *result;
  char *source_local;
  
  if (source == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_CreateFromString",0x126,1,"Invalid argument - source is NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0x90);
    if ((IOTHUB_MESSAGE_HANDLE_DATA *)l == (IOTHUB_MESSAGE_HANDLE_DATA *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"IoTHubMessage_CreateFromString",0x12e,1,"malloc failed");
      }
    }
    else {
      memset(l,0,0x90);
      ((IOTHUB_MESSAGE_HANDLE_DATA *)l)->contentType = IOTHUBMESSAGE_STRING;
      pSVar2 = STRING_construct(source);
      (((IOTHUB_MESSAGE_HANDLE_DATA *)l)->value).string = pSVar2;
      if (pSVar2 == (STRING_HANDLE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                    ,"IoTHubMessage_CreateFromString",0x138,1,"STRING_construct failed");
        }
        DestroyMessageData((IOTHUB_MESSAGE_HANDLE_DATA *)l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        pMVar3 = Map_Create(ValidateAsciiCharactersFilter);
        ((IOTHUB_MESSAGE_HANDLE_DATA *)l)->properties = pMVar3;
        if (pMVar3 == (MAP_HANDLE)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                      ,"IoTHubMessage_CreateFromString",0x13e,1,"Map_Create for properties failed");
          }
          DestroyMessageData((IOTHUB_MESSAGE_HANDLE_DATA *)l);
          l = (LOGGER_LOG)0x0;
        }
      }
    }
  }
  return (IOTHUB_MESSAGE_HANDLE)l;
}

Assistant:

IOTHUB_MESSAGE_HANDLE IoTHubMessage_CreateFromString(const char* source)
{
    IOTHUB_MESSAGE_HANDLE_DATA* result;
    if (source == NULL)
    {
        LogError("Invalid argument - source is NULL");
        result = NULL;
    }
    else
    {
        result = (IOTHUB_MESSAGE_HANDLE_DATA*)malloc(sizeof(IOTHUB_MESSAGE_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("malloc failed");
            /*let it go through*/
        }
        else
        {
            memset(result, 0, sizeof(*result));
            result->contentType = IOTHUBMESSAGE_STRING;

            if ((result->value.string = STRING_construct(source)) == NULL)
            {
                LogError("STRING_construct failed");
                DestroyMessageData(result);
                result = NULL;
            }
            else if ((result->properties = Map_Create(ValidateAsciiCharactersFilter)) == NULL)
            {
                LogError("Map_Create for properties failed");
                DestroyMessageData(result);
                result = NULL;
            }
        }
    }
    return result;
}